

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O0

void SubtractGreenFromBlueAndRed_SSE2(uint32_t *argb_data,int num_pixels)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  int in_ESI;
  long in_RDI;
  undefined1 auVar4 [16];
  __m128i out;
  __m128i C;
  __m128i B;
  __m128i A;
  __m128i in;
  int i;
  int local_68;
  ushort local_48;
  ushort uStack_46;
  ushort uStack_44;
  ushort uStack_42;
  ushort uStack_40;
  ushort uStack_3e;
  ushort uStack_3c;
  ushort uStack_3a;
  char local_38;
  char cStack_37;
  char cStack_36;
  char cStack_35;
  char cStack_34;
  char cStack_33;
  char cStack_32;
  char cStack_31;
  char cStack_30;
  char cStack_2f;
  char cStack_2e;
  char cStack_2d;
  char cStack_2c;
  char cStack_2b;
  char cStack_2a;
  char cStack_29;
  char local_28;
  char cStack_27;
  char cStack_26;
  char cStack_25;
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  char cStack_20;
  char cStack_1f;
  char cStack_1e;
  char cStack_1d;
  char cStack_1c;
  char cStack_1b;
  char cStack_1a;
  char cStack_19;
  
  for (local_68 = 0; local_68 + 4 <= in_ESI; local_68 = local_68 + 4) {
    puVar3 = (undefined8 *)(in_RDI + (long)local_68 * 4);
    uVar1 = *puVar3;
    uVar2 = puVar3[1];
    local_48 = (ushort)uVar1;
    uStack_46 = (ushort)((ulong)uVar1 >> 0x10);
    uStack_44 = (ushort)((ulong)uVar1 >> 0x20);
    uStack_40 = (ushort)uVar2;
    uStack_3e = (ushort)((ulong)uVar2 >> 0x10);
    uStack_3c = (ushort)((ulong)uVar2 >> 0x20);
    auVar4._2_2_ = uStack_46 >> 8;
    auVar4._0_2_ = local_48 >> 8;
    auVar4._4_2_ = uStack_44 >> 8;
    auVar4._6_2_ = (ushort)((ulong)uVar1 >> 0x38);
    auVar4._8_2_ = uStack_40 >> 8;
    auVar4._10_2_ = uStack_3e >> 8;
    auVar4._12_2_ = uStack_3c >> 8;
    auVar4._14_2_ = (ushort)((ulong)uVar2 >> 0x38);
    auVar4 = pshuflw(auVar4,auVar4,0xa0);
    auVar4 = pshufhw(auVar4,auVar4,0xa0);
    local_28 = (char)uVar1;
    cStack_27 = (char)((ulong)uVar1 >> 8);
    cStack_26 = (char)((ulong)uVar1 >> 0x10);
    cStack_25 = (char)((ulong)uVar1 >> 0x18);
    cStack_24 = (char)((ulong)uVar1 >> 0x20);
    cStack_23 = (char)((ulong)uVar1 >> 0x28);
    cStack_22 = (char)((ulong)uVar1 >> 0x30);
    cStack_21 = (char)((ulong)uVar1 >> 0x38);
    cStack_20 = (char)uVar2;
    cStack_1f = (char)((ulong)uVar2 >> 8);
    cStack_1e = (char)((ulong)uVar2 >> 0x10);
    cStack_1d = (char)((ulong)uVar2 >> 0x18);
    cStack_1c = (char)((ulong)uVar2 >> 0x20);
    cStack_1b = (char)((ulong)uVar2 >> 0x28);
    cStack_1a = (char)((ulong)uVar2 >> 0x30);
    cStack_19 = (char)((ulong)uVar2 >> 0x38);
    local_38 = auVar4[0];
    cStack_37 = auVar4[1];
    cStack_36 = auVar4[2];
    cStack_35 = auVar4[3];
    cStack_34 = auVar4[4];
    cStack_33 = auVar4[5];
    cStack_32 = auVar4[6];
    cStack_31 = auVar4[7];
    cStack_30 = auVar4[8];
    cStack_2f = auVar4[9];
    cStack_2e = auVar4[10];
    cStack_2d = auVar4[0xb];
    cStack_2c = auVar4[0xc];
    cStack_2b = auVar4[0xd];
    cStack_2a = auVar4[0xe];
    cStack_29 = auVar4[0xf];
    puVar3 = (undefined8 *)(in_RDI + (long)local_68 * 4);
    *puVar3 = CONCAT17(cStack_21 - cStack_31,
                       CONCAT16(cStack_22 - cStack_32,
                                CONCAT15(cStack_23 - cStack_33,
                                         CONCAT14(cStack_24 - cStack_34,
                                                  CONCAT13(cStack_25 - cStack_35,
                                                           CONCAT12(cStack_26 - cStack_36,
                                                                    CONCAT11(cStack_27 - cStack_37,
                                                                             local_28 - local_38))))
                                        )));
    puVar3[1] = CONCAT17(cStack_19 - cStack_29,
                         CONCAT16(cStack_1a - cStack_2a,
                                  CONCAT15(cStack_1b - cStack_2b,
                                           CONCAT14(cStack_1c - cStack_2c,
                                                    CONCAT13(cStack_1d - cStack_2d,
                                                             CONCAT12(cStack_1e - cStack_2e,
                                                                      CONCAT11(cStack_1f - cStack_2f
                                                                               ,cStack_20 -
                                                                                cStack_30)))))));
  }
  if (local_68 != in_ESI) {
    VP8LSubtractGreenFromBlueAndRed_C((uint32_t *)(in_RDI + (long)local_68 * 4),in_ESI - local_68);
  }
  return;
}

Assistant:

static void SubtractGreenFromBlueAndRed_SSE2(uint32_t* argb_data,
                                             int num_pixels) {
  int i;
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    const __m128i in = _mm_loadu_si128((__m128i*)&argb_data[i]); // argb
    const __m128i A = _mm_srli_epi16(in, 8);     // 0 a 0 g
    const __m128i B = _mm_shufflelo_epi16(A, _MM_SHUFFLE(2, 2, 0, 0));
    const __m128i C = _mm_shufflehi_epi16(B, _MM_SHUFFLE(2, 2, 0, 0));  // 0g0g
    const __m128i out = _mm_sub_epi8(in, C);
    _mm_storeu_si128((__m128i*)&argb_data[i], out);
  }
  // fallthrough and finish off with plain-C
  if (i != num_pixels) {
    VP8LSubtractGreenFromBlueAndRed_C(argb_data + i, num_pixels - i);
  }
}